

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::SetLoopFieldInitialValue
          (GlobOpt *this,Loop *loop,Instr *instr,PropertySym *propertySym,
          PropertySym *originalPropertySym)

{
  ValueNumber VVar1;
  JitArenaAllocator *pJVar2;
  ValueInfo *pVVar3;
  code *pcVar4;
  StackSym *pSVar5;
  BasicBlock *pBVar6;
  BOOLEAN BVar7;
  bool bVar8;
  uint sourceContextId;
  uint functionId;
  Value *pVVar9;
  undefined4 *puVar10;
  ProfiledInstr *pPVar11;
  ValueType *pVVar12;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  BasicBlock *pBVar13;
  BasicBlock *block;
  BasicBlock *pBVar14;
  undefined1 local_90 [8];
  anon_class_24_3_49332160 CanSetInitialValue;
  StackSym *objectSym;
  Value *currentObjPtrVal;
  Value *local_60;
  Value *landingPadObjPtrVal;
  StackSym *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Value *pVStack_40;
  ValueType profiledValueType;
  Value *initialValue;
  PropertySym *propertySym_local;
  
  pVStack_40 = (Value *)0x0;
  if (((((loop->field_0x178 & 0x80) == 0) &&
       (initialValue = (Value *)propertySym,
       BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                         (loop->fieldKilled,(originalPropertySym->super_Sym).m_id), BVar7 == '\0'))
      && (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (loop->fieldKilled,initialValue[1].valueNumber), BVar7 == '\0')) &&
     (pVVar9 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)initialValue),
     pVVar9 == (Value *)0x0)) {
    bVar8 = JsUtil::
            BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<PropertySym*>
                      ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&loop->initialValueFieldMap,(PropertySym **)&initialValue,
                       &stack0xffffffffffffffc0);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xc98,
                         "(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))",
                         "!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue)");
      if (!bVar8) goto LAB_00455be5;
      *puVar10 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((loop->landingPad->globOptData).liveFields,initialValue[1].valueNumber);
    if (BVar7 == '\0') {
      CanSetInitialValue.objectSym = *(StackSym ***)(initialValue + 2);
      local_50 = (StackSym *)&loop->initialValueFieldMap;
      local_60 = GlobOptBlockData::FindValue
                           (&loop->landingPad->globOptData,(Sym *)CanSetInitialValue.objectSym);
      objectSym = (StackSym *)
                  GlobOptBlockData::FindValue
                            (&this->currentBlock->globOptData,(Sym *)CanSetInitialValue.objectSym);
      local_90 = (undefined1  [8])&objectSym;
      CanSetInitialValue.currentObjPtrVal = &local_60;
      CanSetInitialValue.landingPadObjPtrVal = (Value **)&CanSetInitialValue.objectSym;
      bVar8 = SetLoopFieldInitialValue::anon_class_24_3_49332160::operator()
                        ((anon_class_24_3_49332160 *)local_90);
      if (bVar8) {
        if (instr->m_kind == InstrKindProfiled) {
          pPVar11 = IR::Instr::AsProfiledInstr(instr);
          pVVar12 = (ValueType *)&pPVar11->u;
        }
        else {
          pVVar12 = &ValueType::Uninitialized;
        }
        pSVar5 = local_50;
        local_42 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar12->field_0;
        bVar8 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
        if (bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xcd5,"(!profiledValueType.IsDefinite())",
                             "!profiledValueType.IsDefinite()");
          if (!bVar8) {
LAB_00455be5:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar10 = 0;
        }
        pVStack_40 = NewGenericValue(this,(ValueType)local_42.field_0,(Sym *)initialValue);
        local_50 = StackSym::New(this->func);
        ValueInfo::SetSymStore(pVStack_40->valueInfo,&local_50->super_Sym);
        currentObjPtrVal = ::Value::Copy(pVStack_40,this->alloc,pVStack_40->valueNumber);
        JsUtil::
        BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)pSVar5,(PropertySym **)&initialValue,&currentObjPtrVal);
        pJVar2 = this->alloc;
        VVar1 = pVStack_40->valueNumber;
        landingPadObjPtrVal =
             (Value *)ValueInfo::New(pJVar2,(ValueType)
                                            *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                             &(pVStack_40->valueInfo->super_ValueType).field_0.
                                              field_0);
        pVVar9 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar2,0x3f1274);
        pVVar9->valueNumber = VVar1;
        pVVar9->valueInfo = (ValueInfo *)landingPadObjPtrVal;
        GlobOptBlockData::SetValue(&loop->landingPad->globOptData,pVVar9,(Sym *)initialValue);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((loop->landingPad->globOptData).liveFields,initialValue[1].valueNumber);
        this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
        this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
        bVar8 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,FieldPREPhase,sourceContextId,functionId);
        if (bVar8) {
          pBVar13 = Loop::GetHeadBlock(loop);
          Output::Print(L"** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:",
                        (ulong)pBVar13->number,(ulong)pVStack_40->valueNumber);
          Sym::Dump(&local_50->super_Sym,(ValueType)0x9);
          Output::Print(L"\n    Instr: ");
          IR::Instr::Dump(instr);
          Output::Flush();
        }
        pBVar13 = Loop::GetHeadBlock(loop);
        if (pBVar13 == (BasicBlock *)0x0) {
          pBVar13 = (BasicBlock *)0x0;
        }
        else {
          pBVar13 = Loop::GetHeadBlock(loop);
          pBVar13 = pBVar13->prev;
        }
        pBVar14 = this->currentBlock;
        do {
          pBVar14 = pBVar14->prev;
        } while ((pBVar14->field_0x18 & 1) != 0);
        pBVar6 = pBVar13;
        if (pBVar14 != pBVar13) {
          do {
            landingPadObjPtrVal = (Value *)pBVar6;
            pVVar9 = pVStack_40;
            if (((pBVar14->field_0x18 & 1) == 0) && (pBVar14->dataUseCount != 0)) {
              pJVar2 = this->alloc;
              VVar1 = pVStack_40->valueNumber;
              ValueInfo::SetIsShared(pVStack_40->valueInfo);
              pVVar3 = pVVar9->valueInfo;
              pVVar9 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar2,0x3f1274);
              pVVar9->valueNumber = VVar1;
              pVVar9->valueInfo = pVVar3;
              GlobOptBlockData::SetValue(&pBVar14->globOptData,pVVar9,(Sym *)initialValue);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar14->globOptData).liveFields,initialValue[1].valueNumber);
              pSVar5 = local_50;
              GlobOptBlockData::SetValue(&pBVar14->globOptData,pVVar9,&local_50->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar14->globOptData).liveVarSyms,(pSVar5->super_Sym).m_id);
              pBVar13 = (BasicBlock *)landingPadObjPtrVal;
            }
            pBVar14 = pBVar14->prev;
            pBVar6 = (BasicBlock *)landingPadObjPtrVal;
          } while (pBVar14 != pBVar13);
        }
        pSVar5 = local_50;
        GlobOptBlockData::SetValue(&this->currentBlock->globOptData,pVStack_40,&local_50->super_Sym)
        ;
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((this->currentBlock->globOptData).liveVarSyms,(pSVar5->super_Sym).m_id);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((this->currentBlock->globOptData).liveFields,initialValue[1].valueNumber);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::SetLoopFieldInitialValue(Loop *loop, IR::Instr *instr, PropertySym *propertySym, PropertySym *originalPropertySym)
{
    Value *initialValue = nullptr;
    StackSym *symStore;

    if (loop->allFieldsKilled || loop->fieldKilled->Test(originalPropertySym->m_id) || loop->fieldKilled->Test(propertySym->m_id))
    {
        return;
    }

    // Value already exists
    if (CurrentBlockData()->FindValue(propertySym))
    {
        return;
    }

    // If this initial value was already added, we would find in the current value table.
    Assert(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue));

    // If propertySym is live in landingPad, we don't need an initial value.
    if (loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
    {
        return;
    }

    StackSym * objectSym = propertySym->m_stackSym;
    Value *landingPadObjPtrVal, *currentObjPtrVal;
    landingPadObjPtrVal = loop->landingPad->globOptData.FindValue(objectSym);
    currentObjPtrVal = CurrentBlockData()->FindValue(objectSym);
    
    auto CanSetInitialValue = [&]() -> bool {
        if (!currentObjPtrVal)
        {
            return false;
        }
        if (landingPadObjPtrVal)
        {
            return currentObjPtrVal->GetValueNumber() == landingPadObjPtrVal->GetValueNumber();
        }
        else
        {
            if (!objectSym->IsSingleDef())
            {
                return false;
            }
            IR::Instr * defInstr = objectSym->GetInstrDef();
            IR::Opnd * src1 = defInstr->GetSrc1();
            while (!(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsPropertySym()))
            {
                if (src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->GetStackSym()->IsSingleDef())
                {
                    defInstr = src1->AsRegOpnd()->GetStackSym()->GetInstrDef();
                    src1 = defInstr->GetSrc1();
                }
                else
                {
                    return false;
                }
            }

            return true;

            // Todo: allow other kinds of operands as src1 of instr def of the object sym of the current propertySym
            // SymOpnd, but not PropertySymOpnd - LdSlotArr, some LdSlots (?)
            // nullptr - NewScObject
        }
    };

    if (!CanSetInitialValue())
    {
        // objPtr has a different value in the landing pad.
        return;
    }

    // The opnd's value type has not yet been initialized. Since the property sym doesn't have a value, it effectively has an
    // Uninitialized value type. Use the profiled value type from the instruction.
    const ValueType profiledValueType =
        instr->IsProfiledInstr() ? instr->AsProfiledInstr()->u.FldInfo().valueType : ValueType::Uninitialized;
    Assert(!profiledValueType.IsDefinite()); // Hence the values created here don't need to be tracked for kills
    initialValue = this->NewGenericValue(profiledValueType, propertySym);
    symStore = StackSym::New(this->func);

    initialValue->GetValueInfo()->SetSymStore(symStore);
    loop->initialValueFieldMap.Add(propertySym, initialValue->Copy(this->alloc, initialValue->GetValueNumber()));

    // Copy the initial value into the landing pad, but without a symStore
    Value *landingPadInitialValue = Value::New(this->alloc, initialValue->GetValueNumber(),
        ValueInfo::New(this->alloc, initialValue->GetValueInfo()->Type()));
    loop->landingPad->globOptData.SetValue(landingPadInitialValue, propertySym);
    loop->landingPad->globOptData.liveFields->Set(propertySym->m_id);

#if DBG_DUMP
    if (PHASE_TRACE(Js::FieldPREPhase, this->func))
    {
        Output::Print(_u("** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:"),
            loop->GetHeadBlock()->GetBlockNum(), initialValue->GetValueNumber());
        symStore->Dump();
        Output::Print(_u("\n    Instr: "));
        instr->Dump();
        Output::Flush();
    }
#endif

    // Add initial value to all the previous blocks in the loop.
    FOREACH_BLOCK_BACKWARD_IN_RANGE(block, this->currentBlock->GetPrev(), loop->GetHeadBlock())
    {
        if (block->GetDataUseCount() == 0)
        {
            // All successor blocks have been processed, no point in adding the value.
            continue;
        }
        Value *newValue = initialValue->Copy(this->alloc, initialValue->GetValueNumber());
        block->globOptData.SetValue(newValue, propertySym);
        block->globOptData.liveFields->Set(propertySym->m_id);
        block->globOptData.SetValue(newValue, symStore);
        block->globOptData.liveVarSyms->Set(symStore->m_id);
    } NEXT_BLOCK_BACKWARD_IN_RANGE;

    CurrentBlockData()->SetValue(initialValue, symStore);
    CurrentBlockData()->liveVarSyms->Set(symStore->m_id);
    CurrentBlockData()->liveFields->Set(propertySym->m_id);
}